

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int getPageMMap(Pager *pPager,Pgno pgno,DbPage **ppPage,int flags)

{
  void *pvVar1;
  int iVar2;
  DbPage *pDVar3;
  ulong uVar4;
  u32 iFrame;
  void *pData;
  
  iFrame = 0;
  if (pgno < 2) {
    if (pgno == 0) {
      iVar2 = sqlite3CorruptError(0xcef1);
      return iVar2;
    }
LAB_0022338e:
    iVar2 = getPageNormal(pPager,pgno,ppPage,flags);
    return iVar2;
  }
  if (((flags & 2U) == 0) && (pPager->eState != '\x01')) goto LAB_0022338e;
  if (pPager->pWal != (Wal *)0x0) {
    iVar2 = sqlite3WalFindFrame(pPager->pWal,pgno,&iFrame);
    if (iVar2 != 0) {
      *ppPage = (DbPage *)0x0;
      return iVar2;
    }
    if (iFrame != 0) goto LAB_0022338e;
  }
  pData = (void *)0x0;
  uVar4 = (ulong)(pgno - 1);
  iVar2 = (*pPager->fd->pMethods->xFetch)
                    (pPager->fd,(long)pPager->pageSize * uVar4,pPager->pageSize,&pData);
  if (pData == (void *)0x0 || iVar2 != 0) {
    if (iVar2 == 0) goto LAB_0022338e;
LAB_0022345c:
    pDVar3 = (DbPage *)0x0;
  }
  else {
    if (((pPager->eState < 2) && (pPager->tempFile == '\0')) ||
       (pDVar3 = sqlite3PagerLookup(pPager,pgno), pDVar3 == (DbPage *)0x0)) {
      pvVar1 = pData;
      pDVar3 = pPager->pMmapFreelist;
      if (pDVar3 == (DbPage *)0x0) {
        pDVar3 = (DbPage *)sqlite3MallocZero((ulong)pPager->nExtra + 0x48);
        if (pDVar3 == (DbPage *)0x0) {
          (*pPager->fd->pMethods->xUnfetch)(pPager->fd,(long)pPager->pageSize * uVar4,pvVar1);
          iVar2 = 7;
          goto LAB_0022345c;
        }
        pDVar3->pExtra = pDVar3 + 1;
        pDVar3->flags = 0x20;
        pDVar3->nRef = 1;
        pDVar3->pPager = pPager;
      }
      else {
        pPager->pMmapFreelist = pDVar3->pDirty;
        pDVar3->pDirty = (PgHdr *)0x0;
        *(undefined8 *)pDVar3->pExtra = 0;
      }
      pDVar3->pgno = pgno;
      pDVar3->pData = pvVar1;
      pPager->nMmapOut = pPager->nMmapOut + 1;
    }
    else {
      (*pPager->fd->pMethods->xUnfetch)(pPager->fd,(long)pPager->pageSize * uVar4,pData);
    }
    iVar2 = 0;
  }
  *ppPage = pDVar3;
  return iVar2;
}

Assistant:

static int getPageMMap(
  Pager *pPager,      /* The pager open on the database file */
  Pgno pgno,          /* Page number to fetch */
  DbPage **ppPage,    /* Write a pointer to the page here */
  int flags           /* PAGER_GET_XXX flags */
){
  int rc = SQLITE_OK;
  PgHdr *pPg = 0;
  u32 iFrame = 0;                 /* Frame to read from WAL file */

  /* It is acceptable to use a read-only (mmap) page for any page except
  ** page 1 if there is no write-transaction open or the ACQUIRE_READONLY
  ** flag was specified by the caller. And so long as the db is not a 
  ** temporary or in-memory database.  */
  const int bMmapOk = (pgno>1
   && (pPager->eState==PAGER_READER || (flags & PAGER_GET_READONLY))
  );

  assert( USEFETCH(pPager) );
#ifdef SQLITE_HAS_CODEC
  assert( pPager->xCodec==0 );
#endif

  /* Optimization note:  Adding the "pgno<=1" term before "pgno==0" here
  ** allows the compiler optimizer to reuse the results of the "pgno>1"
  ** test in the previous statement, and avoid testing pgno==0 in the
  ** common case where pgno is large. */
  if( pgno<=1 && pgno==0 ){
    return SQLITE_CORRUPT_BKPT;
  }
  assert( pPager->eState>=PAGER_READER );
  assert( assert_pager_state(pPager) );
  assert( pPager->hasHeldSharedLock==1 );
  assert( pPager->errCode==SQLITE_OK );

  if( bMmapOk && pagerUseWal(pPager) ){
    rc = sqlite3WalFindFrame(pPager->pWal, pgno, &iFrame);
    if( rc!=SQLITE_OK ){
      *ppPage = 0;
      return rc;
    }
  }
  if( bMmapOk && iFrame==0 ){
    void *pData = 0;
    rc = sqlite3OsFetch(pPager->fd, 
        (i64)(pgno-1) * pPager->pageSize, pPager->pageSize, &pData
    );
    if( rc==SQLITE_OK && pData ){
      if( pPager->eState>PAGER_READER || pPager->tempFile ){
        pPg = sqlite3PagerLookup(pPager, pgno);
      }
      if( pPg==0 ){
        rc = pagerAcquireMapPage(pPager, pgno, pData, &pPg);
     }else{
        sqlite3OsUnfetch(pPager->fd, (i64)(pgno-1)*pPager->pageSize, pData);
      }
      if( pPg ){
        assert( rc==SQLITE_OK );
        *ppPage = pPg;
        return SQLITE_OK;
      }
    }
    if( rc!=SQLITE_OK ){
      *ppPage = 0;
      return rc;
    }
  }
  return getPageNormal(pPager, pgno, ppPage, flags);
}